

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_array_suite.cpp
# Opt level: O0

void api_suite::api_ctor_initializer_list(void)

{
  undefined4 local_54;
  size_type local_50;
  undefined4 local_44;
  size_type local_40;
  int local_34;
  undefined1 local_30 [8];
  circular_array<int,_4UL> data;
  
  local_34 = 0x16;
  vista::circular_array<int,_4UL>::circular_array<int>
            ((circular_array<int,_4UL> *)local_30,0xb,&local_34);
  local_40 = vista::circular_view<int,_4UL>::size
                       ((circular_view<int,_4UL> *)(data.super_array<int,_4UL>._M_elems + 2));
  local_44 = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("data.size()","2",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_array_suite.cpp"
             ,0x47,"void api_suite::api_ctor_initializer_list()",&local_40,&local_44);
  local_50 = vista::circular_view<int,_4UL>::capacity
                       ((circular_view<int,_4UL> *)(data.super_array<int,_4UL>._M_elems + 2));
  local_54 = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("data.capacity()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_array_suite.cpp"
             ,0x48,"void api_suite::api_ctor_initializer_list()",&local_50,&local_54);
  return;
}

Assistant:

void api_ctor_initializer_list()
{
    circular_array<int, 4> data({11, 22});
    BOOST_TEST_EQ(data.size(), 2);
    BOOST_TEST_EQ(data.capacity(), 4);
}